

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferParamValueIntToFloatConversion.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferParamValueIntToFloatConversion::TextureBufferParamValueIntToFloatConversion
          (TextureBufferParamValueIntToFloatConversion *this,Context *context,
          ExtParameters *extParams,char *name,char *description)

{
  char *description_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  TextureBufferParamValueIntToFloatConversion *this_local;
  
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBufferParamValueIntToFloatConversion_03263328;
  this->m_cs_id = 0;
  this->m_po_id = 0;
  this->m_ssbo_id = 0;
  this->m_tbo_id = 0;
  this->m_tbo_tex_id = 0;
  return;
}

Assistant:

TextureBufferParamValueIntToFloatConversion::TextureBufferParamValueIntToFloatConversion(Context&			  context,
																						 const ExtParameters& extParams,
																						 const char*		  name,
																						 const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_cs_id(0)
	, m_po_id(0)
	, m_ssbo_id(0)
	, m_tbo_id(0)
	, m_tbo_tex_id(0)
{
	/* Nothing to be done here */
}